

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O3

uint64_t absl::lts_20250127::hash_internal::CityHash64WithSeeds
                   (char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  uint64_t uVar1;
  ulong uVar2;
  
  uVar1 = CityHash64(s,len);
  uVar2 = (uVar1 - seed0 ^ seed1) * -0x622015f714c7d297;
  uVar2 = (uVar2 >> 0x2f ^ seed1 ^ uVar2) * -0x622015f714c7d297;
  return (uVar2 ^ uVar2 >> 0x2f) * -0x622015f714c7d297;
}

Assistant:

uint64_t CityHash64WithSeeds(const char *s, size_t len, uint64_t seed0,
                             uint64_t seed1) {
  return HashLen16(CityHash64(s, len) - seed0, seed1);
}